

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  int iVar6;
  Scalar_ *in_R8;
  long lVar7;
  double dVar8;
  __m128d t;
  CommandLineParser parser;
  _InputArray local_fe0;
  double local_fc8;
  double local_fc0;
  ulong local_fb8;
  Ptr<cv::ximgproc::EdgeDrawing> ed;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fa8;
  _InputArray local_fa0;
  int local_f80;
  int local_f7c;
  int local_f78;
  int local_f74;
  undefined4 local_f70 [2];
  Mat *local_f68;
  undefined8 local_f60;
  vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> lines;
  TickMeter tm1;
  TickMeter tm0;
  undefined8 local_f00;
  VideoCapture capture;
  vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> ellipses;
  vector<LS,_std::allocator<LS>_> linesegments;
  String filename;
  Mat lineImg0;
  int local_e68;
  int local_e64;
  Mat diff;
  Mat lineImg1;
  Mat src;
  EDCircles testEDCircles;
  Mat gray;
  EDLines testEDLines;
  Mat local_708 [96];
  ED local_6a8;
  ED local_480;
  ED testED;
  
  std::__cxx11::string::string
            ((string *)&testEDCircles,
             "{scale|1|}{counter|99999|}{show|false|}{@filename|vtest.avi|}",
             (allocator *)&testEDLines);
  cv::CommandLineParser::CommandLineParser(&parser,argc,argv,(string *)&testEDCircles);
  std::__cxx11::string::~string((string *)&testEDCircles);
  std::__cxx11::string::string((string *)&testEDCircles,"@filename",(allocator *)&testEDLines);
  cv::CommandLineParser::get<std::__cxx11::string>(&filename,&parser,(String *)&testEDCircles,true);
  std::__cxx11::string::~string((string *)&testEDCircles);
  std::__cxx11::string::string((string *)&testEDCircles,"scale",(allocator *)&testEDLines);
  local_fc0 = cv::CommandLineParser::get<double>(&parser,(String *)&testEDCircles,true);
  std::__cxx11::string::~string((string *)&testEDCircles);
  std::__cxx11::string::string((string *)&testEDCircles,"counter",(allocator *)&testEDLines);
  iVar3 = cv::CommandLineParser::get<int>(&parser,(String *)&testEDCircles,true);
  std::__cxx11::string::~string((string *)&testEDCircles);
  std::__cxx11::string::string((string *)&testEDCircles,"show",(allocator *)&testEDLines);
  bVar1 = cv::CommandLineParser::get<bool>(&parser,(String *)&testEDCircles,true);
  std::__cxx11::string::~string((string *)&testEDCircles);
  cv::Mat::Mat(&src);
  cv::Mat::Mat(&gray);
  tm0.counter = 0;
  tm0.sumTime = 0;
  tm0.startTime = 0;
  tm1.counter = 0;
  tm1.sumTime = 0;
  tm1.startTime = 0;
  cv::samples::findFileOrKeep((String *)&testEDCircles,&filename,false);
  cv::VideoCapture::VideoCapture(&capture,(string *)&testEDCircles,0);
  std::__cxx11::string::~string((string *)&testEDCircles);
  cVar2 = cv::VideoCapture::isOpened();
  if (cVar2 != '\0') {
    std::operator<<((ostream *)&std::cout,"Capture is opened, ");
    dVar8 = (double)cv::VideoCapture::get((int)&capture);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    poVar4 = std::operator<<(poVar4," frames");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"Frame [width,height] : [");
    dVar8 = (double)cv::VideoCapture::get((int)&capture);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar4,",");
    dVar8 = (double)cv::VideoCapture::get((int)&capture);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    poVar4 = std::operator<<(poVar4,"]");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)&std::cout,"Scaled[width,height] : [");
    dVar8 = (double)cv::VideoCapture::get((int)&capture);
    poVar4 = std::ostream::_M_insert<double>(dVar8 * local_fc0);
    std::operator<<(poVar4,",");
    dVar8 = (double)cv::VideoCapture::get((int)&capture);
    poVar4 = std::ostream::_M_insert<double>(dVar8 * local_fc0);
    poVar4 = std::operator<<(poVar4,"]");
    std::endl<char,std::char_traits<char>>(poVar4);
    cv::ximgproc::createEdgeDrawing();
    *(undefined8 *)((long)_ed + 0xc) = 0x2400000001;
    *(undefined8 *)((long)_ed + 0x14) = 0x100000008;
    ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_fb8 = 0;
    while( true ) {
      iVar6 = (int)in_R8;
      cv::VideoCapture::operator>>(&capture,&src);
      cVar2 = cv::Mat::empty();
      if (cVar2 != '\0' || iVar3 < 1) break;
      local_fc8 = (double)CONCAT44(local_fc8._4_4_,iVar3);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = 0x1010000;
      testEDLines.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDLines.super_ED.width = 0x2010000;
      local_f00 = 0;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&src;
      testEDLines.super_ED.srcImg = (uchar *)&src;
      cv::resize(local_fc0,local_fc0,&testEDCircles,&testEDLines,&local_f00);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDLines.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = 0x1010000;
      testEDLines.super_ED.width = 0x2010000;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&src;
      testEDLines.super_ED.srcImg = (uchar *)&gray;
      cv::cvtColor((cv *)&testEDCircles,(_InputArray *)&testEDLines,(_OutputArray *)0x6,0,iVar6);
      tm0.startTime = cv::getTickCount();
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = 0x1010000;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&gray;
      (**(code **)(*_ed + 0x40))(_ed,&testEDCircles);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = -0x7dfcffe3;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&lines;
      (**(code **)(*_ed + 0x60))(_ed,&testEDCircles);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = -0x7dfcffd2;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&ellipses;
      (**(code **)(*_ed + 0x68))(_ed,&testEDCircles);
      cv::TickMeter::stop(&tm0);
      iVar3 = local_fc8._0_4_;
      tm1.startTime = cv::getTickCount();
      cv::Mat::Mat(local_708,&gray);
      in_R8 = (Scalar_ *)0x8;
      ED::ED(&testED,local_708,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
      cv::Mat::~Mat(local_708);
      ED::ED(&local_480,&testED);
      EDLines::EDLines(&testEDLines,&local_480,1.0,-1,6.0,1.3);
      ED::~ED(&local_480);
      ED::ED(&local_6a8,&testEDLines.super_ED);
      EDCircles::EDCircles(&testEDCircles,&local_6a8);
      ED::~ED(&local_6a8);
      cv::TickMeter::stop(&tm1);
      if (bVar1) {
        EDLines::getLines(&linesegments,&testEDLines);
        EDLines::getLineImage((EDLines *)&lineImg0);
        in_R8 = (Scalar_ *)&diff;
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)in_R8,255.0);
        cv::Mat::Mat(&lineImg1,local_e68,local_e64,0,in_R8);
        lVar7 = 0xc;
        for (uVar5 = 0;
            uVar5 < (ulong)((long)lines.
                                  super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)lines.
                                  super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1
            ) {
          local_fa0.sz.width = 0;
          local_fa0.sz.height = 0;
          local_fa0.flags = 0x3010000;
          local_fa0.obj = &lineImg1;
          local_f78 = (int)ROUND(*(float *)(lines.
                                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0xc
                                           ));
          local_f74 = (int)ROUND(*(float *)(lines.
                                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8))
          ;
          local_f80 = (int)ROUND(*(float *)(lines.
                                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7 + -4))
          ;
          local_f7c = (int)ROUND(*(float *)(lines.
                                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7));
          cv::Scalar_<double>::Scalar_((Scalar_<double> *)&diff,0.0);
          in_R8 = (Scalar_ *)0x1;
          cv::line(&local_fa0,&local_f78,&local_f80,&diff,1,0x10,0);
          lVar7 = lVar7 + 0x10;
        }
        cv::Mat::Mat(&diff);
        local_fa0.sz.width = 0;
        local_fa0.sz.height = 0;
        local_fa0.flags = 0x1010000;
        local_fe0.sz.width = 0;
        local_fe0.sz.height = 0;
        local_fa0.obj = &lineImg0;
        local_f60 = 0;
        local_fe0.flags = 0x1010000;
        local_fe0.obj = &lineImg1;
        local_f70[0] = 0x2010000;
        local_f68 = &diff;
        cv::absdiff(&local_fa0,&local_fe0,(_OutputArray *)local_f70);
        std::__cxx11::string::string((string *)&local_fa0,"lineImg0",(allocator *)local_f70);
        iVar3 = local_fc8._0_4_;
        local_fe0.sz.width = 0;
        local_fe0.sz.height = 0;
        local_fe0.flags = 0x1010000;
        local_fe0.obj = &lineImg0;
        cv::imshow((string *)&local_fa0,&local_fe0);
        std::__cxx11::string::~string((string *)&local_fa0);
        std::__cxx11::string::string((string *)&local_fa0,"lineImg1",(allocator *)local_f70);
        local_fe0.sz.width = 0;
        local_fe0.sz.height = 0;
        local_fe0.flags = 0x1010000;
        local_fe0.obj = &lineImg1;
        cv::imshow((string *)&local_fa0,&local_fe0);
        std::__cxx11::string::~string((string *)&local_fa0);
        std::__cxx11::string::string((string *)&local_fa0,"diff",(allocator *)local_f70);
        local_fe0.sz.width = 0;
        local_fe0.sz.height = 0;
        local_fe0.flags = 0x1010000;
        local_fe0.obj = &diff;
        cv::imshow((string *)&local_fa0,&local_fe0);
        std::__cxx11::string::~string((string *)&local_fa0);
        std::__cxx11::string::string((string *)&local_fa0,"gray",(allocator *)local_f70);
        local_fe0.sz.width = 0;
        local_fe0.sz.height = 0;
        local_fe0.flags = 0x1010000;
        local_fe0.obj = &gray;
        cv::imshow((string *)&local_fa0,&local_fe0);
        std::__cxx11::string::~string((string *)&local_fa0);
        cv::waitKey(0);
        cv::Mat::~Mat(&diff);
        cv::Mat::~Mat(&lineImg1);
        cv::Mat::~Mat(&lineImg0);
        std::_Vector_base<LS,_std::allocator<LS>_>::~_Vector_base
                  (&linesegments.super__Vector_base<LS,_std::allocator<LS>_>);
      }
      iVar3 = iVar3 + -1;
      local_fb8 = (ulong)((int)local_fb8 + 1);
      EDCircles::~EDCircles(&testEDCircles);
      EDLines::~EDLines(&testEDLines);
      ED::~ED(&testED);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"OpenCV    processed ");
    iVar3 = (int)local_fb8;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::operator<<(poVar4," frames in    ");
    dVar8 = cv::TickMeter::getTimeMilli(&tm0);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar4," ms.");
    std::operator<<((ostream *)&std::cout,"\t\tfps : ");
    dVar8 = cv::TickMeter::getTimeMilli(&tm0);
    local_fc8 = (double)(iVar3 * 1000);
    poVar4 = std::ostream::_M_insert<double>(local_fc8 / dVar8);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"EDCircles processed ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::operator<<(poVar4," frames in    ");
    dVar8 = cv::TickMeter::getTimeMilli(&tm1);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar4," ms.");
    std::operator<<((ostream *)&std::cout,"\t\tfps : ");
    dVar8 = cv::TickMeter::getTimeMilli(&tm1);
    poVar4 = std::ostream::_M_insert<double>(local_fc8 / dVar8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::_Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::~_Vector_base
              (&lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>);
    std::_Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::~_Vector_base
              (&ellipses.
                super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_fa8);
  }
  cv::VideoCapture::~VideoCapture(&capture);
  cv::Mat::~Mat(&gray);
  cv::Mat::~Mat(&src);
  std::__cxx11::string::~string((string *)&filename);
  cv::CommandLineParser::~CommandLineParser(&parser);
  return 0;
}

Assistant:

int main(int argc, const char** argv)
{
    cv::CommandLineParser parser(argc, argv,
        "{scale|1|}"
        "{counter|99999|}"
        "{show|false|}"
        "{@filename|vtest.avi|}"
    );

    String filename = parser.get<string>("@filename");
    double scale = parser.get<double>("scale");
    int test_counter = parser.get<int>("counter");
    bool show = parser.get<bool>("show");
    Mat src, gray;
    TickMeter tm0, tm1;
    int counter = 0;

    VideoCapture capture(samples::findFileOrKeep(filename));
    if (capture.isOpened())
    {
        cout << "Capture is opened, " << capture.get(CAP_PROP_FRAME_COUNT) << " frames" << endl;
        cout << "Frame [width,height] : ["  << capture.get(CAP_PROP_FRAME_WIDTH) << "," << capture.get(CAP_PROP_FRAME_HEIGHT) << "]" << endl;
        cout << "Scaled[width,height] : [" << capture.get(CAP_PROP_FRAME_WIDTH) * scale << "," << capture.get(CAP_PROP_FRAME_HEIGHT) * scale << "]" << endl;;

        Ptr<EdgeDrawing> ed = createEdgeDrawing();
        ed->params.EdgeDetectionOperator = EdgeDrawing::SOBEL;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 8;
        ed->params.ScanInterval = 1;
        vector<Vec6d> ellipses;
        vector<Vec4f> lines;

        for (;;)
        {
            capture >> src;
            test_counter--;

            if (src.empty() || test_counter < 0)
                break;

            resize(src, src, Size(), scale, scale);
            cvtColor(src, gray, COLOR_BGR2GRAY);

            tm0.start();
            ed->detectEdges(gray);
            ed->detectLines(lines);
            ed->detectEllipses(ellipses);
            tm0.stop();
            counter++;

            tm1.start();
            ED testED = ED(gray, SOBEL_OPERATOR, 36, 8, 1, 10, 1.0, true);
            EDLines testEDLines = EDLines(testED);
            EDCircles testEDCircles = EDCircles(testEDLines);
            tm1.stop();

            if (show)
            {
                std::vector<LS> linesegments = testEDLines.getLines();

                Mat lineImg0 = testEDLines.getLineImage();    //draws on an empty image
                Mat lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

                for (int i = 0; i < lines.size(); i++)
                    line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

                Mat diff;
                absdiff(lineImg0, lineImg1, diff);
                imshow("lineImg0", lineImg0);
                imshow("lineImg1", lineImg1);
                imshow("diff", diff);
                imshow("gray", gray);
                waitKey();
            }
        }

        cout << "OpenCV    processed " << counter << " frames in    " << tm0.getTimeMilli() << " ms.";
        cout << "\t\tfps : " << counter * 1000 / tm0.getTimeMilli() << endl;

        cout << "EDCircles processed " << counter << " frames in    " << tm1.getTimeMilli() << " ms.";
        cout << "\t\tfps : " << counter * 1000 / tm1.getTimeMilli() << endl;
    }
    return 0;
}